

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O3

void __thiscall xray_re::xr_visual_object::save(xr_visual_object *this,xr_writer *w)

{
  undefined8 in_RAX;
  undefined8 local_18;
  
  local_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,0x900,&SCENEOBJ_VERSION,2,false);
  xr_writer::open_chunk(w,0x902);
  local_18 = CONCAT44(local_18._4_4_,*(undefined4 *)&(this->super_xr_custom_object).field_0x6c);
  (*w->_vptr_xr_writer[2])(w,&local_18,4);
  local_18 = local_18 & 0xffffffff;
  (*w->_vptr_xr_writer[2])(w,(long)&local_18 + 4,4);
  xr_writer::w_sz(w,&this->m_reference);
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,0x905,&this->m_flags,4,false);
  return;
}

Assistant:

void xr_visual_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(SCENEOBJ_CHUNK_VERSION, SCENEOBJ_VERSION);
	w.open_chunk(SCENEOBJ_CHUNK_REFERENCE);
	w.w_u32(m_file_version);
	w.w_u32(0);
	w.w_sz(m_reference);
	w.close_chunk();
	w.w_chunk<uint32_t>(SCENEOBJ_CHUNK_FLAGS, m_flags);
}